

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer.hpp
# Opt level: O2

void print_message<char[25],__2>
               (Printer *printer,anon_class_1_0_00000001 *color,char *severity,char (*t) [25])

{
  char *severity_local;
  Format<const_char_*> local_68;
  PrintTuple<char[6],_Format<const_char_*>,_char[6]> local_50;
  PrintTuple<char[5],_PrintTuple<char[6],_Format<const_char_*>,_char[6]>,_char[6]> local_30;
  
  local_68.t.t0 = &severity_local;
  severity_local = "error";
  local_50.t.t0 = &local_68;
  local_68.s = "%: ";
  local_30.t.t0 = &local_50;
  local_50.t0 = (char (*) [6])0x135a93;
  local_50.t.t.t0 = (char (*) [6])0x135653;
  local_30.t0 = (char (*) [5])0x135642;
  local_30.t.t.t0 = (char (*) [6])0x135647;
  PrintTuple<char[5],_PrintTuple<char[6],_Format<const_char_*>,_char[6]>,_char[6]>::print
            (&local_30,printer);
  Printer::print(printer,(char *)color);
  Printer::print(printer,'\n');
  return;
}

Assistant:

void print_message(const Printer& printer, const C& color, const char* severity, const T& t) {
	printer.print(bold(color(format("%: ", severity))));
	printer.print(t);
	printer.print('\n');
}